

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example_dr<false>(cb_to_cs *c,example *ec,label *ld,label *cs_ld)

{
  size_t sVar1;
  cb_class *pcVar2;
  cb_class **ppcVar3;
  v_array<CB::cb_class> *in_RDX;
  long in_RDI;
  cb_class *cl;
  cb_class *__end4;
  cb_class *__begin4;
  v_array<CB::cb_class> *__range4;
  uint32_t i_1;
  wclass temp;
  uint32_t i;
  wclass *in_stack_ffffffffffffffa8;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffb0;
  cb_class *pcVar4;
  undefined8 in_stack_ffffffffffffffb8;
  label *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_24;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffb0);
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffb0);
  sVar1 = v_array<CB::cb_class>::size(in_RDX);
  if (sVar1 == 0) {
    for (local_24 = 1; local_24 <= *(uint *)(in_RDI + 8); local_24 = local_24 + 1) {
      v_array<COST_SENSITIVE::wclass>::push_back
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    return;
  }
  sVar1 = v_array<CB::cb_class>::size(in_RDX);
  if (sVar1 == 0) {
LAB_0033cd92:
    for (uVar5 = 1; uVar5 <= *(uint *)(in_RDI + 8); uVar5 = uVar5 + 1) {
      gen_cs_label<false>((cb_to_cs *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (example *)CONCAT44(in_stack_ffffffffffffffcc,uVar5),
                          in_stack_ffffffffffffffc0,
                          (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
  }
  else {
    sVar1 = v_array<CB::cb_class>::size(in_RDX);
    if (sVar1 == 1) {
      pcVar2 = v_array<CB::cb_class>::operator[](in_RDX,0);
      if ((pcVar2->cost != 3.4028235e+38) || (NAN(pcVar2->cost))) goto LAB_0033cd92;
    }
    ppcVar3 = v_array<CB::cb_class>::begin(in_RDX);
    pcVar2 = *ppcVar3;
    ppcVar3 = v_array<CB::cb_class>::end(in_RDX);
    pcVar4 = *ppcVar3;
    for (; pcVar2 != pcVar4; pcVar2 = pcVar2 + 1) {
      gen_cs_label<false>((cb_to_cs *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (example *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          (label *)in_RDX,(uint32_t)((ulong)pcVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs& c, example& ec, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{  // this implements the doubly robust method
  cs_ld.costs.clear();
  c.pred_scores.costs.clear();
  if (ld.costs.size() == 0)  // a test example
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {  // Explicit declaration for a weak compiler.
      COST_SENSITIVE::wclass temp = {FLT_MAX, i, 0., 0.};
      cs_ld.costs.push_back(temp);
    }
  else if (ld.costs.size() == 0 || (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX))
    // this is a typical example where we can perform all actions
    // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++) gen_cs_label<is_learn>(c, ec, cs_ld, i);
  else  // this is an example where we can only perform a subset of the actions
    // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs) gen_cs_label<is_learn>(c, ec, cs_ld, cl.action);
}